

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void make_size_image(png_store *ps,png_byte colour_type,png_byte bit_depth,int interlace_type,
                    png_uint_32 w,png_uint_32 h,int do_interlace)

{
  char cVar1;
  jmp_buf *pa_Var2;
  png_uint_32 pVar3;
  png_uint_16 pVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  byte bVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  char *name_00;
  ulong uVar12;
  png_byte *buffer;
  png_bytep row;
  ulong uVar13;
  char *error_message;
  ulong uVar14;
  int do_tRNS;
  ulong uVar15;
  png_uint_32 toIndex;
  png_store *ppVar16;
  bool bVar17;
  bool bVar18;
  png_infop pi;
  int local_a20;
  uint local_a1c;
  uint local_a18;
  uint local_a14;
  uint local_a10;
  uint local_a0c;
  png_uint_32 local_a08;
  png_uint_32 local_a04;
  png_store *local_a00;
  uint local_9f8;
  uint local_9f4;
  uint local_9f0;
  png_uint_32 xstep;
  uint local_9e8;
  uint local_9e4;
  ulong local_9e0;
  ulong local_9d8;
  jmp_buf *local_9d0;
  png_byte tempRow [128];
  char name [64];
  jmp_buf exception__env;
  char copy [64];
  
  pa_Var2 = pm.this.exception_context.penv;
  local_a20 = (int)CONCAT71(in_register_00000011,bit_depth);
  pm.this.exception_context.penv = &exception__env;
  iVar5 = _setjmp((__jmp_buf_tag *)pm.this.exception_context.penv);
  if (iVar5 != 0) {
    pm.this.exception_context.caught = 1;
    pm.this.exception_context.penv = pa_Var2;
    store_write_reset(pm.this.exception_context.v.etmp);
    return;
  }
  local_9d0 = pa_Var2;
  uVar6 = (uint)ps & 0xff;
  uVar15 = (ulong)colour_type;
  uVar11 = local_a20 << 0xd | uVar6 + (uint)colour_type * 8;
  local_9e4 = w * 0x1000000 + interlace_type * 0x10000 + uVar11 + (uint)(h != 0) * 0x8000;
  local_a08 = h;
  standard_name_from_id(name,0x40,(ulong)local_9e4,uVar11);
  local_a00 = (png_store *)set_store_for_write((png_store *)&pi,(png_infopp)name,name_00);
  iVar5 = local_a20;
  if (local_a00 == (png_store *)0x0) {
    pm.this.exception_context.v.etmp = &pm.this;
    longjmp((__jmp_buf_tag *)pm.this.exception_context.penv,1);
  }
  uVar8 = 0;
  local_a04 = w;
  local_9f0 = (uint)colour_type;
  png_set_IHDR((png_const_structrp)local_a00,pi,interlace_type,w,(uint)colour_type,uVar6,local_a20,0
               ,0);
  ppVar16 = local_a00;
  do_tRNS = (int)uVar15;
  tempRow[0] = '\0';
  tempRow[1] = '\0';
  tempRow[2] = '\0';
  tempRow[3] = '\0';
  tempRow._8_8_ = make_size_image::key;
  uVar12 = (ulong)(byte)pm.this.wname[0];
  if (pm.this.wname[0] != '\0') {
    uVar14 = 0;
    do {
      uVar13 = uVar14;
      do_tRNS = (int)uVar15;
      copy[uVar13] = (char)uVar12;
      if (uVar13 == 0x3f) {
        uVar14 = 0x40;
        break;
      }
      cVar1 = pm.this.wname[uVar13 + 1];
      uVar15 = CONCAT71((int7)(uVar15 >> 8),cVar1);
      do_tRNS = (int)uVar15;
      uVar14 = uVar13 + 1;
      uVar12 = uVar15 & 0xffffffff;
    } while (cVar1 != '\0');
    uVar8 = 0x3f;
    if (uVar13 < 0x3f) {
      uVar8 = uVar14;
    }
  }
  copy[uVar8] = '\0';
  tempRow._16_8_ = copy;
  tempRow[0x20] = '\0';
  tempRow[0x21] = '\0';
  tempRow[0x22] = '\0';
  tempRow[0x23] = '\0';
  tempRow[0x24] = '\0';
  tempRow[0x25] = '\0';
  tempRow[0x26] = '\0';
  tempRow[0x27] = '\0';
  tempRow[0x28] = '\0';
  tempRow[0x29] = '\0';
  tempRow[0x2a] = '\0';
  tempRow[0x2b] = '\0';
  tempRow[0x2c] = '\0';
  tempRow[0x2d] = '\0';
  tempRow[0x2e] = '\0';
  tempRow[0x2f] = '\0';
  tempRow[0x30] = '\0';
  tempRow[0x31] = '\0';
  tempRow[0x32] = '\0';
  tempRow[0x33] = '\0';
  tempRow[0x34] = '\0';
  tempRow[0x35] = '\0';
  tempRow[0x36] = '\0';
  tempRow[0x37] = '\0';
  tempRow._24_8_ = uVar8;
  png_set_text((png_const_structrp)local_a00,pi,(png_const_textp)tempRow,1);
  if ((png_byte)ps == '\x03') {
    init_standard_palette
              (ppVar16,(png_structp)pi,(png_infop)(ulong)(uint)(1 << (colour_type & 0x1f)),0,do_tRNS
              );
  }
  png_write_info((png_structrp)ppVar16,pi);
  uVar6 = bit_size((png_const_structp)ppVar16,(png_byte)ps,(png_byte)local_9f0);
  sVar9 = png_get_rowbytes((png_const_structrp)ppVar16,pi);
  if (sVar9 == uVar6 * interlace_type + 7 >> 3) {
    uVar11 = 1;
    if (iVar5 != 0) {
      if (iVar5 != 1) {
        error_message = "invalid interlace type";
        goto LAB_00113dfe;
      }
      uVar11 = 7;
    }
    buffer = (png_byte *)copy;
    local_a1c = interlace_type;
    local_a0c = uVar11;
    memset(buffer,0xff,0x800);
    if ((local_a08 != 0) ||
       (uVar11 = png_set_interlace_handling((png_structrp)ppVar16), local_a0c == uVar11)) {
      pVar3 = local_a04;
      if (local_a04 != 0) {
        uVar8 = (ulong)local_a04;
        uVar15 = 0;
        do {
          size_row(buffer,uVar6 * interlace_type,(png_uint_32)uVar15);
          uVar15 = uVar15 + 1;
          buffer = buffer + 0x80;
        } while (uVar8 != uVar15);
      }
      bVar17 = local_a08 != 0;
      bVar18 = local_a20 == 1;
      local_9d8 = (ulong)pVar3;
      local_a10 = 0;
      ppVar16 = local_a00;
      uVar11 = local_a1c;
      local_9e8 = uVar6;
      do {
        uVar6 = local_a10 + 1;
        local_a14 = local_a10;
        if (local_a04 != 0) {
          bVar10 = (byte)(7 - local_a10 >> 1);
          xstep = 1 << (bVar10 & 0x1f);
          if (local_a10 < 2) {
            xstep = 8;
            bVar10 = 3;
          }
          local_a18 = (local_a10 & 1) << (3U - (char)(uVar6 >> 1) & 0x1f) & 7;
          local_9f4 = (~(-1 << (bVar10 & 0x1f)) + uVar11) - local_a18 >> (bVar10 & 0x1f);
          bVar10 = (char)(7 - local_a10) * '\x04';
          local_9f8 = 0x1145af0U >> (bVar10 & 0x1f) & 0xf0 | 0x110145afU >> (bVar10 & 0x1f) & 0xf;
          uVar15 = 0;
          local_a10 = uVar6;
          do {
            uVar6 = local_9e8;
            pVar3 = xstep;
            row = (png_bytep)(copy + uVar15 * 0x80);
            uVar8 = uVar15;
            if (bVar18 && bVar17) {
              if (((local_9f8 >> ((uint)uVar15 & 7) & 1) != 0) && (local_9f4 != 0)) {
                tempRow[0x70] = 0xff;
                tempRow[0x71] = 0xff;
                tempRow[0x72] = 0xff;
                tempRow[0x73] = 0xff;
                tempRow[0x74] = 0xff;
                tempRow[0x75] = 0xff;
                tempRow[0x76] = 0xff;
                tempRow[0x77] = 0xff;
                tempRow[0x78] = 0xff;
                tempRow[0x79] = 0xff;
                tempRow[0x7a] = 0xff;
                tempRow[0x7b] = 0xff;
                tempRow[0x7c] = 0xff;
                tempRow[0x7d] = 0xff;
                tempRow[0x7e] = 0xff;
                tempRow[0x7f] = 0xff;
                tempRow[0x60] = 0xff;
                tempRow[0x61] = 0xff;
                tempRow[0x62] = 0xff;
                tempRow[99] = 0xff;
                tempRow[100] = 0xff;
                tempRow[0x65] = 0xff;
                tempRow[0x66] = 0xff;
                tempRow[0x67] = 0xff;
                tempRow[0x68] = 0xff;
                tempRow[0x69] = 0xff;
                tempRow[0x6a] = 0xff;
                tempRow[0x6b] = 0xff;
                tempRow[0x6c] = 0xff;
                tempRow[0x6d] = 0xff;
                tempRow[0x6e] = 0xff;
                tempRow[0x6f] = 0xff;
                tempRow[0x50] = 0xff;
                tempRow[0x51] = 0xff;
                tempRow[0x52] = 0xff;
                tempRow[0x53] = 0xff;
                tempRow[0x54] = 0xff;
                tempRow[0x55] = 0xff;
                tempRow[0x56] = 0xff;
                tempRow[0x57] = 0xff;
                tempRow[0x58] = 0xff;
                tempRow[0x59] = 0xff;
                tempRow[0x5a] = 0xff;
                tempRow[0x5b] = 0xff;
                tempRow[0x5c] = 0xff;
                tempRow[0x5d] = 0xff;
                tempRow[0x5e] = 0xff;
                tempRow[0x5f] = 0xff;
                tempRow[0x40] = 0xff;
                tempRow[0x41] = 0xff;
                tempRow[0x42] = 0xff;
                tempRow[0x43] = 0xff;
                tempRow[0x44] = 0xff;
                tempRow[0x45] = 0xff;
                tempRow[0x46] = 0xff;
                tempRow[0x47] = 0xff;
                tempRow[0x48] = 0xff;
                tempRow[0x49] = 0xff;
                tempRow[0x4a] = 0xff;
                tempRow[0x4b] = 0xff;
                tempRow[0x4c] = 0xff;
                tempRow[0x4d] = 0xff;
                tempRow[0x4e] = 0xff;
                tempRow[0x4f] = 0xff;
                tempRow[0x30] = 0xff;
                tempRow[0x31] = 0xff;
                tempRow[0x32] = 0xff;
                tempRow[0x33] = 0xff;
                tempRow[0x34] = 0xff;
                tempRow[0x35] = 0xff;
                tempRow[0x36] = 0xff;
                tempRow[0x37] = 0xff;
                tempRow[0x38] = 0xff;
                tempRow[0x39] = 0xff;
                tempRow[0x3a] = 0xff;
                tempRow[0x3b] = 0xff;
                tempRow[0x3c] = 0xff;
                tempRow[0x3d] = 0xff;
                tempRow[0x3e] = 0xff;
                tempRow[0x3f] = 0xff;
                tempRow[0x28] = 0xff;
                tempRow[0x29] = 0xff;
                tempRow[0x2a] = 0xff;
                tempRow[0x2b] = 0xff;
                tempRow[0x20] = 0xff;
                tempRow[0x21] = 0xff;
                tempRow[0x22] = 0xff;
                tempRow[0x23] = 0xff;
                tempRow[0x24] = 0xff;
                tempRow[0x25] = 0xff;
                tempRow[0x26] = 0xff;
                tempRow[0x27] = 0xff;
                tempRow[0x2c] = 0xff;
                tempRow[0x2d] = 0xff;
                tempRow[0x2e] = 0xff;
                tempRow[0x2f] = 0xff;
                tempRow[0x10] = 0xff;
                tempRow[0x11] = 0xff;
                tempRow[0x12] = 0xff;
                tempRow[0x13] = 0xff;
                tempRow[0x14] = 0xff;
                tempRow[0x15] = 0xff;
                tempRow[0x16] = 0xff;
                tempRow[0x17] = 0xff;
                tempRow[0x18] = 0xff;
                tempRow[0x19] = 0xff;
                tempRow[0x1a] = 0xff;
                tempRow[0x1b] = 0xff;
                tempRow[0x1c] = 0xff;
                tempRow[0x1d] = 0xff;
                tempRow[0x1e] = 0xff;
                tempRow[0x1f] = 0xff;
                tempRow[0] = 0xff;
                tempRow[1] = 0xff;
                tempRow[2] = 0xff;
                tempRow[3] = 0xff;
                tempRow[4] = 0xff;
                tempRow[5] = 0xff;
                tempRow[6] = 0xff;
                tempRow[7] = 0xff;
                tempRow[8] = 0xff;
                tempRow[9] = 0xff;
                tempRow[10] = 0xff;
                tempRow[0xb] = 0xff;
                tempRow[0xc] = 0xff;
                tempRow[0xd] = 0xff;
                tempRow[0xe] = 0xff;
                tempRow[0xf] = 0xff;
                row = tempRow;
                if (local_a18 < uVar11) {
                  toIndex = 0;
                  uVar7 = local_a18;
                  local_9e0 = uVar15;
                  do {
                    pixel_copy(tempRow,toIndex,(png_const_bytep)(copy + uVar15 * 0x80),uVar7,uVar6,0
                              );
                    toIndex = toIndex + 1;
                    uVar7 = uVar7 + pVar3;
                    ppVar16 = local_a00;
                    uVar11 = local_a1c;
                    uVar8 = local_9e0;
                  } while (uVar7 < local_a1c);
                }
                goto LAB_00113cb4;
              }
            }
            else {
LAB_00113cb4:
              local_9e0 = uVar8;
              pVar4 = random_u16();
              uVar15 = local_9e0;
              uVar7 = 8 << ((char)pVar4 + (char)(pVar4 / 5) * -5 & 0x1fU);
              uVar6 = uVar7;
              if (uVar7 < 0x20) {
                uVar6 = uVar7 | 0x20;
              }
              if (uVar11 == 1) {
                uVar6 = uVar7 | 0x20;
              }
              if (local_a14 != 0 || (int)local_9e0 != 0) {
                uVar6 = uVar7;
              }
              png_set_filter((png_structrp)ppVar16,0,uVar6);
              png_write_row((png_structrp)ppVar16,row);
            }
            uVar15 = uVar15 + 1;
            uVar6 = local_a10;
          } while (uVar15 != local_9d8);
        }
        local_a10 = uVar6;
        if (local_a10 == local_a0c) {
          copy[0] = '\0';
          copy[1] = '\0';
          copy[2] = '\0';
          copy[3] = '\0';
          copy._8_8_ = make_size_image::key_1;
          copy._16_8_ = make_size_image::comment;
          copy[0x18] = '\x03';
          copy[0x19] = '\0';
          copy[0x1a] = '\0';
          copy[0x1b] = '\0';
          copy[0x1c] = '\0';
          copy[0x1d] = '\0';
          copy[0x1e] = '\0';
          copy[0x1f] = '\0';
          copy[0x20] = '\0';
          copy[0x21] = '\0';
          copy[0x22] = '\0';
          copy[0x23] = '\0';
          copy[0x24] = '\0';
          copy[0x25] = '\0';
          copy[0x26] = '\0';
          copy[0x27] = '\0';
          copy[0x28] = '\0';
          copy[0x29] = '\0';
          copy[0x2a] = '\0';
          copy[0x2b] = '\0';
          copy[0x2c] = '\0';
          copy[0x2d] = '\0';
          copy[0x2e] = '\0';
          copy[0x2f] = '\0';
          copy[0x30] = '\0';
          copy[0x31] = '\0';
          copy[0x32] = '\0';
          copy[0x33] = '\0';
          copy[0x34] = '\0';
          copy[0x35] = '\0';
          copy[0x36] = '\0';
          copy[0x37] = '\0';
          png_set_text((png_const_structrp)ppVar16,pi,(png_const_textp)copy,1);
          png_write_end((png_structrp)ppVar16,pi);
          store_storefile((png_store *)(ulong)local_9e4,(png_uint_32)pi);
          store_write_reset(&pm.this);
          pm.this.exception_context.penv = local_9d0;
          pm.this.exception_context.caught = 0;
          return;
        }
      } while( true );
    }
    error_message = "write: png_set_interlace_handling failed";
  }
  else {
    error_message = "size row size incorrect";
  }
LAB_00113dfe:
  png_error((png_const_structrp)ppVar16,error_message);
}

Assistant:

static void
make_size_image(png_store* const ps, png_byte const colour_type,
    png_byte const bit_depth, int const interlace_type,
    png_uint_32 const w, png_uint_32 const h,
    int const do_interlace)
{
   context(ps, fault);

   check_interlace_type(interlace_type);

   Try
   {
      png_infop pi;
      png_structp pp;
      unsigned int pixel_size;

      /* Make a name and get an appropriate id for the store: */
      char name[FILE_NAME_SIZE];
      png_uint_32 id = FILEID(colour_type, bit_depth, 0/*palette*/,
         interlace_type, w, h, do_interlace);

      standard_name_from_id(name, sizeof name, 0, id);
      pp = set_store_for_write(ps, &pi, name);

      /* In the event of a problem return control to the Catch statement below
       * to do the clean up - it is not possible to 'return' directly from a Try
       * block.
       */
      if (pp == NULL)
         Throw ps;

      png_set_IHDR(pp, pi, w, h, bit_depth, colour_type, interlace_type,
         PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

#ifdef PNG_TEXT_SUPPORTED
      {
         static char key[] = "image name"; /* must be writeable */
         size_t pos;
         png_text text;
         char copy[FILE_NAME_SIZE];

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         /* Yuck: the text must be writable! */
         pos = safecat(copy, sizeof copy, 0, ps->wname);
         text.text = copy;
         text.text_length = pos;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      if (colour_type == 3) /* palette */
         init_standard_palette(ps, pp, pi, 1U << bit_depth, 0/*do tRNS*/);

      png_write_info(pp, pi);

      /* Calculate the bit size, divide by 8 to get the byte size - this won't
       * overflow because we know the w values are all small enough even for
       * a system where 'unsigned int' is only 16 bits.
       */
      pixel_size = bit_size(pp, colour_type, bit_depth);
      if (png_get_rowbytes(pp, pi) != ((w * pixel_size) + 7) / 8)
         png_error(pp, "size row size incorrect");

      else
      {
         int npasses = npasses_from_interlace_type(pp, interlace_type);
         png_uint_32 y;
         int pass;
         png_byte image[16][SIZE_ROWMAX];

         /* To help consistent error detection make the parts of this buffer
          * that aren't set below all '1':
          */
         memset(image, 0xff, sizeof image);

         if (!do_interlace &&
             npasses != set_write_interlace_handling(pp, interlace_type))
            png_error(pp, "write: png_set_interlace_handling failed");

         /* Prepare the whole image first to avoid making it 7 times: */
         for (y=0; y<h; ++y)
            size_row(image[y], w * pixel_size, y);

         for (pass=0; pass<npasses; ++pass)
         {
            /* The following two are for checking the macros: */
            png_uint_32 wPass = PNG_PASS_COLS(w, pass);

            /* If do_interlace is set we don't call png_write_row for every
             * row because some of them are empty.  In fact, for a 1x1 image,
             * most of them are empty!
             */
            for (y=0; y<h; ++y)
            {
               png_const_bytep row = image[y];
               png_byte tempRow[SIZE_ROWMAX];

               /* If do_interlace *and* the image is interlaced we
                * need a reduced interlace row; this may be reduced
                * to empty.
                */
               if (do_interlace && interlace_type == PNG_INTERLACE_ADAM7)
               {
                  /* The row must not be written if it doesn't exist, notice
                   * that there are two conditions here, either the row isn't
                   * ever in the pass or the row would be but isn't wide
                   * enough to contribute any pixels.  In fact the wPass test
                   * can be used to skip the whole y loop in this case.
                   */
                  if (PNG_ROW_IN_INTERLACE_PASS(y, pass) && wPass > 0)
                  {
                     /* Set to all 1's for error detection (libpng tends to
                      * set unset things to 0).
                      */
                     memset(tempRow, 0xff, sizeof tempRow);
                     interlace_row(tempRow, row, pixel_size, w, pass,
                           0/*data always bigendian*/);
                     row = tempRow;
                  }
                  else
                     continue;
               }

#           ifdef PNG_WRITE_FILTER_SUPPORTED
               /* Only get to here if the row has some pixels in it, set the
                * filters to 'all' for the very first row and thereafter to a
                * single filter.  It isn't well documented, but png_set_filter
                * does accept a filter number (per the spec) as well as a bit
                * mask.
                *
                * The code now uses filters at random, except that on the first
                * row of an image it ensures that a previous row filter is in
                * the set so that libpng allocates the row buffer.
                */
               {
                  int filters = 8 << random_mod(PNG_FILTER_VALUE_LAST);

                  if (pass == 0 && y == 0 &&
                      (filters < PNG_FILTER_UP || w == 1U))
                     filters |= PNG_FILTER_UP;

                  png_set_filter(pp, 0/*method*/, filters);
               }
#           endif

               png_write_row(pp, row);
            }
         }
      }

#ifdef PNG_TEXT_SUPPORTED
      {
         static char key[] = "end marker";
         static char comment[] = "end";
         png_text text;

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         text.text = comment;
         text.text_length = (sizeof comment)-1;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      png_write_end(pp, pi);

      /* And store this under the appropriate id, then clean up. */
      store_storefile(ps, id);

      store_write_reset(ps);
   }

   Catch(fault)
   {
      /* Use the png_store returned by the exception. This may help the compiler
       * because 'ps' is not used in this branch of the setjmp.  Note that fault
       * and ps will always be the same value.
       */
      store_write_reset(fault);
   }
}